

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

Qiniu_Error Qiniu_Client_config(Qiniu_Client *self)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  Qiniu_Error QVar5;
  
  pcVar3 = Qiniu_OK.message;
  uVar4 = Qiniu_OK.code;
  pvVar1 = self->curl;
  if (self->boundNic == (char *)0x0) {
LAB_001111c6:
    if ((self->lowSpeedLimit < 1) || (self->lowSpeedTime < 1)) {
LAB_0011120e:
      if (0 < self->timeoutMs) {
        iVar2 = curl_easy_setopt(pvVar1,0x9b);
        if (iVar2 != 0) {
          pcVar3 = "Can not specify the timeout";
          goto LAB_0011125c;
        }
      }
      if (self->connectTimeoutMs < 1) goto LAB_00111261;
      iVar2 = curl_easy_setopt(pvVar1,0x9c);
      if (iVar2 == 0) goto LAB_00111261;
      pcVar3 = "Can not specify the connect timeout";
    }
    else {
      iVar2 = curl_easy_setopt(pvVar1,0x13);
      if (iVar2 == 0) {
        iVar2 = curl_easy_setopt(pvVar1,0x14,self->lowSpeedTime);
        if (iVar2 == 0) goto LAB_0011120e;
        pcVar3 = "Can not specify the low speed time";
      }
      else {
        pcVar3 = "Can not specify the low speed limit";
      }
    }
  }
  else {
    iVar2 = curl_easy_setopt(pvVar1,0x274e);
    if (iVar2 == 0) goto LAB_001111c6;
    pcVar3 = "Can not bind the given NIC";
  }
LAB_0011125c:
  uVar4 = 0x270a;
LAB_00111261:
  QVar5._4_4_ = 0;
  QVar5.code = uVar4;
  QVar5.message = pcVar3;
  return QVar5;
}

Assistant:

Qiniu_Error Qiniu_Client_config(Qiniu_Client *self)
{
    int retCode = 0;
    Qiniu_Error err = Qiniu_OK;
    CURL *curl = (CURL *)self->curl;

    // Bind the NIC for sending packets.
    if (self->boundNic != NULL)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_INTERFACE, self->boundNic);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not bind the given NIC";
            return err;
        }
    }

    // Specify the low speed limit and time
    if (self->lowSpeedLimit > 0 && self->lowSpeedTime > 0)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, self->lowSpeedLimit);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the low speed limit";
            return err;
        }
        retCode = curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, self->lowSpeedTime);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the low speed time";
            return err;
        }
    }

    // Specify the timeout
    if (self->timeoutMs > 0)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_TIMEOUT_MS, self->timeoutMs);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the timeout";
            return err;
        }
    }

    // Specify the connect timeout
    if (self->connectTimeoutMs > 0)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_CONNECTTIMEOUT_MS, self->connectTimeoutMs);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the connect timeout";
            return err;
        }
    }

    return err;
}